

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLText * __thiscall tinyxml2::XMLDocument::NewText(XMLDocument *this,char *str)

{
  XMLText *pXVar1;
  
  pXVar1 = (XMLText *)MemPoolT<96>::Alloc(&this->_textPool);
  (pXVar1->super_XMLNode)._document = this;
  (pXVar1->super_XMLNode)._parent = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._value._flags = 0;
  (pXVar1->super_XMLNode)._value._start = (char *)0x0;
  (pXVar1->super_XMLNode)._value._end = (char *)0x0;
  (pXVar1->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._prev = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._next = (XMLNode *)0x0;
  (pXVar1->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00267978;
  pXVar1->_isCData = false;
  (pXVar1->super_XMLNode)._memPool = &(this->_textPool).super_MemPool;
  StrPair::SetStr(&(pXVar1->super_XMLNode)._value,str,0);
  return pXVar1;
}

Assistant:

XMLText* XMLDocument::NewText( const char* str )
{
    TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
    XMLText* text = new (_textPool.Alloc()) XMLText( this );
    text->_memPool = &_textPool;
    text->SetValue( str );
    return text;
}